

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect_bounder.cc
# Opt level: O1

void __thiscall S2LatLngRectBounder::AddPoint(S2LatLngRectBounder *this,S2Point *b)

{
  bool bVar1;
  S2LatLng local_40;
  S2LogMessage local_30;
  
  bVar1 = S2::IsUnitLength(b);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect_bounder.cc"
               ,0x22,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: S2::IsUnitLength(b) ",0x22);
    if (!bVar1) {
      abort();
    }
  }
  S2LatLng::S2LatLng(&local_40,b);
  AddInternal(this,b,&local_40);
  return;
}

Assistant:

void S2LatLngRectBounder::AddPoint(const S2Point& b) {
  S2_DCHECK(S2::IsUnitLength(b));
  AddInternal(b, S2LatLng(b));
}